

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int revnum(int x,int y,int d,char (*board) [8],STATE s,int f)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  iVar1 = dir[d][0];
  iVar2 = dir[d][1];
  uVar8 = iVar1 + x;
  uVar9 = iVar2 + y;
  if (uVar9 < 8 && uVar8 < 8) {
    uVar6 = x + iVar1 * 2;
    lVar5 = 0;
    uVar7 = y + iVar2 * 2;
    do {
      if ((s == WHITE | WHITE) != (int)board[uVar8][uVar9]) {
        if ((int)board[uVar8][uVar9] != s) {
          return 0;
        }
        iVar4 = (int)lVar5;
        if (iVar4 == 0 || f == 0) {
          return iVar4;
        }
        pcVar3 = board[(long)x + (long)iVar1] + (long)y + (long)iVar2;
        do {
          *pcVar3 = (char)s;
          pcVar3 = pcVar3 + (long)iVar2 + (long)iVar1 * 8;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
        return iVar4;
      }
      if (7 < uVar6) {
        return 0;
      }
      uVar8 = uVar8 + iVar1;
      uVar9 = uVar9 + iVar2;
      lVar5 = lVar5 + 1;
      uVar6 = uVar6 + iVar1;
      bVar10 = uVar7 < 8;
      uVar7 = iVar2 + uVar7;
    } while (bVar10);
  }
  return 0;
}

Assistant:

int revnum(int x, int y, int d, char board[][SIZE], STATE s, int f) {
    int x0 = x, y0 = y;
    int a = dir[d][0], b = dir[d][1];
    int num = 0, flag = 0;
    STATE rs = (s == WHITE ? BLACK : WHITE);
    x += a;
    y += b;
    while (x >= 0 && x < SIZE && y >= 0 && y < SIZE) {
        if (board[x][y] == rs) {
            num++;
        } else if (board[x][y] == s) {
            flag = 1;
            break;
        } else {
            break;
        }
        x += a;
        y += b;
    }
    if (flag) {
        if (f) {
            int k;
            for (k = 1; k <= num; k++) {
                x = x0 + a * k;
                y = y0 + b * k;
                board[x][y] = s;
            }
        }
        return num;
    }
    return 0;
}